

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::executeRGBA8ColorWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,PixelBufferAccess *colorBuffer)

{
  deUint8 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  deUint8 *pdVar7;
  float *pfVar8;
  deUint8 *dstPtr;
  Fragment *frag;
  int fragSampleNdx;
  int regSampleNdx;
  deUint8 *basePtr;
  int yStride;
  int xStride;
  int fragStride;
  PixelBufferAccess *colorBuffer_local;
  Fragment *inputFragments_local;
  int numSamplesPerFragment_local;
  int fragNdxOffset_local;
  FragmentProcessor *this_local;
  
  iVar2 = tcu::ConstPixelBufferAccess::getRowPitch(&colorBuffer->super_ConstPixelBufferAccess);
  iVar3 = tcu::ConstPixelBufferAccess::getSlicePitch(&colorBuffer->super_ConstPixelBufferAccess);
  pvVar6 = tcu::PixelBufferAccess::getDataPtr(colorBuffer);
  for (frag._4_4_ = 0; frag._4_4_ < 0x40; frag._4_4_ = frag._4_4_ + 1) {
    if ((this->m_sampleRegister[frag._4_4_].isAlive & 1U) != 0) {
      iVar4 = tcu::Vector<int,_2>::x
                        (&inputFragments[fragNdxOffset + frag._4_4_ / numSamplesPerFragment].
                          pixelCoord);
      iVar5 = tcu::Vector<int,_2>::y
                        (&inputFragments[fragNdxOffset + frag._4_4_ / numSamplesPerFragment].
                          pixelCoord);
      pdVar7 = (deUint8 *)
               ((long)pvVar6 +
               (long)(iVar5 * iVar3) +
               (long)(iVar4 * iVar2) + (long)(frag._4_4_ % numSamplesPerFragment << 2));
      pfVar8 = tcu::Vector<float,_3>::x(&this->m_sampleRegister[frag._4_4_].blendedRGB);
      dVar1 = tcu::floatToU8(*pfVar8);
      *pdVar7 = dVar1;
      pfVar8 = tcu::Vector<float,_3>::y(&this->m_sampleRegister[frag._4_4_].blendedRGB);
      dVar1 = tcu::floatToU8(*pfVar8);
      pdVar7[1] = dVar1;
      pfVar8 = tcu::Vector<float,_3>::z(&this->m_sampleRegister[frag._4_4_].blendedRGB);
      dVar1 = tcu::floatToU8(*pfVar8);
      pdVar7[2] = dVar1;
      dVar1 = tcu::floatToU8(this->m_sampleRegister[frag._4_4_].blendedA);
      pdVar7[3] = dVar1;
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeRGBA8ColorWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const tcu::PixelBufferAccess& colorBuffer)
{
	const int		fragStride	= 4;
	const int		xStride		= colorBuffer.getRowPitch();
	const int		yStride		= colorBuffer.getSlicePitch();
	deUint8* const	basePtr		= (deUint8*)colorBuffer.getDataPtr();

	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			const int			fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			deUint8*			dstPtr			= basePtr + fragSampleNdx*fragStride + frag.pixelCoord.x()*xStride + frag.pixelCoord.y()*yStride;

			dstPtr[0] = tcu::floatToU8(m_sampleRegister[regSampleNdx].blendedRGB.x());
			dstPtr[1] = tcu::floatToU8(m_sampleRegister[regSampleNdx].blendedRGB.y());
			dstPtr[2] = tcu::floatToU8(m_sampleRegister[regSampleNdx].blendedRGB.z());
			dstPtr[3] = tcu::floatToU8(m_sampleRegister[regSampleNdx].blendedA);
		}
	}
}